

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

ProString * __thiscall ProString::mid(ProString *this,int off,int len)

{
  uint in_ECX;
  int in_EDX;
  ProString *in_RSI;
  ProString *in_RDI;
  ProString *ret;
  ProString *pPVar1;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  int local_14;
  
  uVar2 = 0;
  pPVar1 = in_RDI;
  memset(in_RDI,0xaa,0x30);
  ProString((ProString *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),in_RSI,
            (OmitPreHashing)((ulong)pPVar1 >> 0x20));
  local_14 = in_EDX;
  if (in_RSI->m_length < in_EDX) {
    local_14 = in_RSI->m_length;
  }
  pPVar1->m_offset = local_14 + pPVar1->m_offset;
  pPVar1->m_length = pPVar1->m_length - local_14;
  if (in_ECX < (uint)pPVar1->m_length) {
    pPVar1->m_length = in_ECX;
  }
  return in_RDI;
}

Assistant:

ProString ProString::mid(int off, int len) const
{
    ProString ret(*this, NoHash);
    if (off > m_length)
        off = m_length;
    ret.m_offset += off;
    ret.m_length -= off;
    if ((uint)ret.m_length > (uint)len)  // Unsigned comparison to interpret < 0 as infinite
        ret.m_length = len;
    return ret;
}